

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int denoise(int argc,char **argv)

{
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  *this;
  bool bVar1;
  Allocator AVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  int c;
  long lVar5;
  long lVar6;
  Point2i PVar7;
  ulong uVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_02;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_03;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_05;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  anon_class_8_1_5d0e180a checkForChannels;
  allocator<char> local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9;
  char *local_8d8;
  char **argv_local;
  WrapMode2D local_8c8;
  string outFilename;
  string inFilename;
  Image filteredVariance;
  _Any_data local_768;
  code *local_758;
  code *local_750;
  ColorEncodingHandle local_740;
  Float xySigmaIndir [2];
  ColorEncodingHandle local_730;
  ImageChannelDesc varianceDesc;
  ImageChannelDesc albedoDesc;
  ImageChannelDesc zDesc;
  ImageChannelDesc rgbDesc;
  ImageChannelValues jointSigmaIndir;
  ImageChannelDesc jointDesc;
  ImageChannelDesc nsDesc;
  ImageChannelDesc nDesc;
  ImageChannelDesc deltaZDesc;
  ImageChannelValues Ldenoised;
  string local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_4e8;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  optional<int> oStack_4c8;
  optional<float> oStack_4c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_4b8;
  undefined8 uStack_4b0;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_4a8;
  Image denoisedImage;
  Image result;
  ImageAndMetadata im;
  
  inFilename._M_dataplus._M_p = (pointer)&inFilename.field_2;
  outFilename._M_dataplus._M_p = (pointer)&outFilename.field_2;
  inFilename._M_string_length = 0;
  outFilename._M_string_length = 0;
  inFilename.field_2._M_local_buf[0] = '\0';
  outFilename.field_2._M_local_buf[0] = '\0';
  local_8d8 = "multiple input filenames provided.";
  argv_local = argv;
  while (*argv_local != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&im,"outfile",(allocator<char> *)&filteredVariance);
    local_768._M_unused._M_object = (void *)0x0;
    local_768._8_8_ = 0;
    local_750 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2030:20)>
                ::_M_invoke;
    local_758 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:2030:20)>
                ::_M_manager;
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&im,&outFilename,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_768);
    std::_Function_base::~_Function_base((_Function_base *)&local_768);
    std::__cxx11::string::~string((string *)&im);
    if (!bVar1) {
      if (**argv_local == '-') {
        usage("denoise","%s: unknown command flag");
      }
      if (inFilename._M_string_length != 0) goto LAB_002648c2;
      std::__cxx11::string::assign((char *)&inFilename);
      argv_local = argv_local + 1;
    }
  }
  if (inFilename._M_string_length == 0) {
    local_8d8 = "input image filename must be provided.";
  }
  else {
    if (outFilename._M_string_length != 0) {
      AVar2.memoryResource = pstd::pmr::new_delete_resource();
      local_730.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      pbrt::Image::Read(&im,&inFilename,AVar2,&local_730);
      checkForChannels.inFilename = &inFilename;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"R",(allocator<char> *)&denoisedImage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filteredVariance.channelNames.field_2.fixed,"G",
                 (allocator<char> *)&result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 1),"B",
                 (allocator<char> *)&Ldenoised);
      requestedChannels.n = 3;
      requestedChannels.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&rgbDesc,&im.image,requestedChannels);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&rgbDesc,"R,G,B");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"Pz",(allocator<char> *)&denoisedImage);
      requestedChannels_00.n = 1;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&zDesc,&im.image,requestedChannels_00);
      std::__cxx11::string::~string((string *)&filteredVariance);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&zDesc,"Pz");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"dzdx",(allocator<char> *)&denoisedImage);
      this = &filteredVariance.channelNames.field_2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this->fixed,"dzdy",(allocator<char> *)&result);
      requestedChannels_01.n = 2;
      requestedChannels_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&deltaZDesc,&im.image,requestedChannels_01);
      lVar5 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&deltaZDesc,"dzdx,dzdy");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"Nx",(allocator<char> *)&denoisedImage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this->fixed,"Ny",(allocator<char> *)&result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 1),"Nz",
                 (allocator<char> *)&Ldenoised);
      requestedChannels_02.n = 3;
      requestedChannels_02.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&nDesc,&im.image,requestedChannels_02);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&nDesc,"Nx,Ny,Nz");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"Nsx",(allocator<char> *)&denoisedImage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filteredVariance.channelNames.field_2.fixed,"Nsy",
                 (allocator<char> *)&result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 1),"Nsz",
                 (allocator<char> *)&Ldenoised);
      requestedChannels_03.n = 3;
      requestedChannels_03.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&nsDesc,&im.image,requestedChannels_03);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&nsDesc,"Nsx,Nsy,Nsz");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"Albedo.R",(allocator<char> *)&denoisedImage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filteredVariance.channelNames.field_2.fixed,"Albedo.G",
                 (allocator<char> *)&result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 1),"Albedo.B",
                 (allocator<char> *)&Ldenoised);
      requestedChannels_04.n = 3;
      requestedChannels_04.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&albedoDesc,&im.image,requestedChannels_04);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      denoise::anon_class_8_1_5d0e180a::operator()
                (&checkForChannels,&albedoDesc,"Albedo.R,Albedo.G,Albedo.B");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"rgbVariance",(allocator<char> *)&denoisedImage);
      requestedChannels_05.n = 1;
      requestedChannels_05.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&varianceDesc,&im.image,requestedChannels_05);
      std::__cxx11::string::~string((string *)&filteredVariance);
      denoise::anon_class_8_1_5d0e180a::operator()(&checkForChannels,&varianceDesc,"rgbVariance");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filteredVariance,"Pz",(allocator<char> *)&denoisedImage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)filteredVariance.channelNames.field_2.fixed,"Nx",
                 (allocator<char> *)&result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 1),"Ny",
                 (allocator<char> *)&Ldenoised);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(filteredVariance.channelNames.field_2.fixed + 2),"Nz",
                 (allocator<char> *)&jointSigmaIndir);
      requestedChannels_06.n = 4;
      requestedChannels_06.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filteredVariance;
      pbrt::Image::GetChannelDesc(&jointDesc,&im.image,requestedChannels_06);
      lVar5 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&filteredVariance.format + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      pbrt::ImageChannelValues::ImageChannelValues(&jointSigmaIndir,4,1.0);
      xySigmaIndir[0] = 2.0;
      xySigmaIndir[1] = 2.0;
      pbrt::Image::JointBilateralFilter
                (&filteredVariance,&im.image,&varianceDesc,7,xySigmaIndir,&jointDesc,
                 &jointSigmaIndir);
      denoiseImage(&denoisedImage,&im.image,&rgbDesc,&filteredVariance,&albedoDesc,&zDesc,
                   &deltaZDesc,&nsDesc,3,3);
      PVar7 = im.image.resolution;
      std::__cxx11::string::string<std::allocator<char>>((string *)&Ldenoised,"R",&local_8d9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                  nAlloc,"G",&local_8da);
      std::__cxx11::string::string<std::allocator<char>>(local_538,"B",&local_8db);
      local_740.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      AVar2.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = 3;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Ldenoised
      ;
      pbrt::Image::Image(&result,Float,PVar7,channels,&local_740,AVar2);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&Ldenoised.
                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                           alloc.memoryResource + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      TVar3 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
      for (lVar5 = 0; lVar5 < (long)TVar3 >> 0x20; lVar5 = lVar5 + 1) {
        local_8d8 = (char *)(lVar5 << 0x20);
        for (uVar8 = 0; (long)uVar8 < (long)TVar3.x; uVar8 = uVar8 + 1) {
          pbrt::WrapMode2D::WrapMode2D(&local_8c8,Clamp);
          PVar7.super_Tuple2<pbrt::Point2,_int> =
               (Tuple2<pbrt::Point2,_int>)((ulong)local_8d8 | uVar8);
          pbrt::Image::GetChannels(&Ldenoised,&denoisedImage,PVar7,local_8c8);
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                      *)Ldenoised.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
            if (Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                ptr == (float *)0x0) {
              paVar4 = &Ldenoised.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        field_2;
            }
            pbrt::Image::SetChannel(&result,PVar7,(int)lVar6,paVar4->fixed[lVar6]);
          }
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    (&Ldenoised.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
          TVar3 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
        }
      }
      _Stack_4a8.super__Rb_tree_header._M_header._M_left =
           &_Stack_4a8.super__Rb_tree_header._M_header;
      aStack_4b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
      uStack_4b0._0_1_ = false;
      uStack_4b0._1_7_ = 0;
      _Stack_4a8._0_8_ = 0;
      _Stack_4a8.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_4a8.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_4a8.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      uStack_4f8 = 0;
      uStack_4f0 = 0;
      aStack_4e8._0_8_ = 0;
      aStack_4e8._8_8_ = 0;
      uStack_4d8 = 0;
      local_4d0 = 0;
      oStack_4c8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      oStack_4c8.set = false;
      oStack_4c8._5_3_ = 0;
      oStack_4c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      oStack_4c0.set = false;
      oStack_4c0._5_3_ = 0;
      local_538[0] = (string)0x0;
      local_538[1] = (string)0x0;
      local_538[2] = (string)0x0;
      local_538[3] = (string)0x0;
      local_538[4] = (string)0x0;
      local_538[5] = (string)0x0;
      local_538[6] = (string)0x0;
      local_538[7] = (string)0x0;
      uStack_530 = 0;
      uStack_528 = 0;
      uStack_520 = 0;
      uStack_518 = 0;
      uStack_510 = 0;
      uStack_508 = 0;
      uStack_500 = 0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
      memoryResource = (memory_resource *)0x0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr =
           (float *)0x0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2.
      _0_8_ = 0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.field_2.
      _8_8_ = 0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc = 0;
      Ldenoised.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored = 0;
      _Stack_4a8.super__Rb_tree_header._M_node_count = 0;
      _Stack_4a8.super__Rb_tree_header._M_header._M_right =
           _Stack_4a8.super__Rb_tree_header._M_header._M_left;
      bVar1 = pbrt::Image::Write(&result,&outFilename,(ImageMetadata *)&Ldenoised);
      pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&Ldenoised);
      if (!bVar1) {
        fprintf(_stderr,"%s: couldn\'t write image.\n",outFilename._M_dataplus._M_p);
      }
      pbrt::Image::~Image(&result);
      pbrt::Image::~Image(&denoisedImage);
      pbrt::Image::~Image(&filteredVariance);
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&jointSigmaIndir.
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&jointDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&varianceDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&albedoDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&nsDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&nDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&deltaZDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&zDesc.offset);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&rgbDesc.offset);
      pbrt::ImageAndMetadata::~ImageAndMetadata(&im);
      std::__cxx11::string::~string((string *)&outFilename);
      std::__cxx11::string::~string((string *)&inFilename);
      return (uint)!bVar1;
    }
    local_8d8 = "output image filename must be provided.";
  }
LAB_002648c2:
  usage("denoise",local_8d8);
}

Assistant:

int denoise(int argc, char *argv[]) {
    std::string inFilename, outFilename;

    auto onError = [](const std::string &err) {
        usage("denoise", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "outfile", &outFilename, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("denoise", "%s: unknown command flag", *argv);
        else if (inFilename.empty()) {
            inFilename = *argv;
            ++argv;
        } else
            usage("denoise", "multiple input filenames provided.");
    }
    if (inFilename.empty())
        usage("denoise", "input image filename must be provided.");
    if (outFilename.empty())
        usage("denoise", "output image filename must be provided.");

    ImageAndMetadata im = Image::Read(inFilename);
    Image &in = im.image;

    auto checkForChannels = [&inFilename](ImageChannelDesc &desc, const char *names) {
        if (!desc) {
            fprintf(stderr, "%s: didn't find \"%s\" channels.\n", inFilename.c_str(),
                    names);
            exit(1);
        }
    };
    ImageChannelDesc rgbDesc = in.GetChannelDesc({"R", "G", "B"});
    checkForChannels(rgbDesc, "R,G,B");
    ImageChannelDesc zDesc = in.GetChannelDesc({"Pz"});
    checkForChannels(zDesc, "Pz");
    ImageChannelDesc deltaZDesc = in.GetChannelDesc({"dzdx", "dzdy"});
    checkForChannels(deltaZDesc, "dzdx,dzdy");
    ImageChannelDesc nDesc = in.GetChannelDesc({"Nx", "Ny", "Nz"});
    checkForChannels(nDesc, "Nx,Ny,Nz");
    ImageChannelDesc nsDesc = in.GetChannelDesc({"Nsx", "Nsy", "Nsz"});
    checkForChannels(nsDesc, "Nsx,Nsy,Nsz");
    ImageChannelDesc albedoDesc = in.GetChannelDesc({"Albedo.R", "Albedo.G", "Albedo.B"});
    checkForChannels(albedoDesc, "Albedo.R,Albedo.G,Albedo.B");
    ImageChannelDesc varianceDesc = in.GetChannelDesc({"rgbVariance"});
    checkForChannels(varianceDesc, "rgbVariance");

    ImageChannelDesc jointDesc = in.GetChannelDesc({"Pz", "Nx", "Ny", "Nz"});
    ImageChannelValues jointSigmaIndir(4, 1);
    Float xySigmaIndir[2] = {2.f, 2.f};
    Image filteredVariance = in.JointBilateralFilter(varianceDesc, 7, xySigmaIndir,
                                                     jointDesc, jointSigmaIndir);

    int halfWidth = 3;
    int nLevels = 3;
    Image denoisedImage = denoiseImage(in, rgbDesc, filteredVariance, albedoDesc, zDesc,
                                       deltaZDesc, nsDesc, halfWidth, nLevels);

    Image result(PixelFormat::Float, in.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < in.Resolution().y; ++y)
        for (int x = 0; x < in.Resolution().x; ++x) {
            ImageChannelValues Ldenoised = denoisedImage.GetChannels({x, y});
            for (int c = 0; c < 3; ++c)
                result.SetChannel({x, y}, c, Ldenoised[c]);
        }

    if (!result.Write(outFilename)) {
        fprintf(stderr, "%s: couldn't write image.\n", outFilename.c_str());
        return 1;
    }
    return 0;
}